

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O0

void Imf_3_2::anon_unknown_9::convertFloatToHalf64_f16c(unsigned_short *dst,float *src)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float *src_local;
  unsigned_short *dst_local;
  
  auVar1 = vcvtps2ph_f16c(*(undefined1 (*) [32])src,0);
  auVar2 = vcvtps2ph_f16c(*(undefined1 (*) [32])(src + 8),0);
  auVar3 = vcvtps2ph_f16c(*(undefined1 (*) [32])(src + 0x10),0);
  auVar4 = vcvtps2ph_f16c(*(undefined1 (*) [32])(src + 0x18),0);
  *(undefined1 (*) [16])dst = auVar1;
  *(undefined1 (*) [16])(dst + 8) = auVar2;
  *(undefined1 (*) [16])(dst + 0x10) = auVar3;
  *(undefined1 (*) [16])(dst + 0x18) = auVar4;
  auVar1 = vcvtps2ph_f16c(*(undefined1 (*) [32])(src + 0x20),0);
  auVar2 = vcvtps2ph_f16c(*(undefined1 (*) [32])(src + 0x28),0);
  auVar3 = vcvtps2ph_f16c(*(undefined1 (*) [32])(src + 0x30),0);
  auVar4 = vcvtps2ph_f16c(*(undefined1 (*) [32])(src + 0x38),0);
  *(undefined1 (*) [16])(dst + 0x20) = auVar1;
  *(undefined1 (*) [16])(dst + 0x28) = auVar2;
  *(undefined1 (*) [16])(dst + 0x30) = auVar3;
  *(undefined1 (*) [16])(dst + 0x38) = auVar4;
  return;
}

Assistant:

void
convertFloatToHalf64_f16c (unsigned short* dst, float* src)
{
    //
    // Ordinarily, I'd avoid using inline asm and prefer intrinsics.
    // However, in order to get the intrinsics, we need to tell
    // the compiler to generate VEX instructions.
    //
    // (On the GCC side, -mf16c goes ahead and activates -mavc,
    //  resulting in VEX code. Without -mf16c, no intrinsics..)
    //
    // Now, it's quite likely that we'll find ourselves in situations
    // where we want to build *without* VEX, in order to maintain
    // maximum compatibility. But to get there with intrinsics,
    // we'd need to break out code into a separate file. Bleh.
    // I'll take the asm.
    //

#if defined IMF_HAVE_GCC_INLINEASM_X86
    __asm__("vmovaps       (%0),     %%ymm0         \n"
            "vmovaps   0x20(%0),     %%ymm1         \n"
            "vmovaps   0x40(%0),     %%ymm2         \n"
            "vmovaps   0x60(%0),     %%ymm3         \n"
            "vcvtps2ph $0,           %%ymm0, %%xmm0 \n"
            "vcvtps2ph $0,           %%ymm1, %%xmm1 \n"
            "vcvtps2ph $0,           %%ymm2, %%xmm2 \n"
            "vcvtps2ph $0,           %%ymm3, %%xmm3 \n"
            "vmovdqa   %%xmm0,       0x00(%1)       \n"
            "vmovdqa   %%xmm1,       0x10(%1)       \n"
            "vmovdqa   %%xmm2,       0x20(%1)       \n"
            "vmovdqa   %%xmm3,       0x30(%1)       \n"
            "vmovaps   0x80(%0),     %%ymm0         \n"
            "vmovaps   0xa0(%0),     %%ymm1         \n"
            "vmovaps   0xc0(%0),     %%ymm2         \n"
            "vmovaps   0xe0(%0),     %%ymm3         \n"
            "vcvtps2ph $0,           %%ymm0, %%xmm0 \n"
            "vcvtps2ph $0,           %%ymm1, %%xmm1 \n"
            "vcvtps2ph $0,           %%ymm2, %%xmm2 \n"
            "vcvtps2ph $0,           %%ymm3, %%xmm3 \n"
            "vmovdqa   %%xmm0,       0x40(%1)       \n"
            "vmovdqa   %%xmm1,       0x50(%1)       \n"
            "vmovdqa   %%xmm2,       0x60(%1)       \n"
            "vmovdqa   %%xmm3,       0x70(%1)       \n"
#    ifndef __AVX__
            "vzeroupper                             \n"
#    endif    /* __AVX__ */
            : /* Output  */
            : /* Input   */ "r"(src), "r"(dst)
#    ifndef __AVX__
            : /* Clobber */ "%xmm0", "%xmm1", "%xmm2", "%xmm3", "memory"
#    else
            : /* Clobber */ "%ymm0", "%ymm1", "%ymm2", "%ymm3", "memory"
#    endif /* __AVX__ */
    );
#else
    convertFloatToHalf64_scalar (dst, src);
#endif /* IMF_HAVE_GCC_INLINEASM_X86 */
}